

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client-ws.c
# Opt level: O3

int lws_create_client_ws_object(lws_client_connect_info *i,lws *wsi)

{
  _lws_websocket_related *p_Var1;
  int iVar2;
  
  p_Var1 = (_lws_websocket_related *)lws_zalloc(0xc0,"client ws struct");
  wsi->ws = p_Var1;
  if (p_Var1 == (_lws_websocket_related *)0x0) {
    _lws_log(4,"OOM\n");
    iVar2 = 1;
  }
  else {
    iVar2 = 0xd;
    if (1 < i->ietf_version_or_minus_one + 1U) {
      iVar2 = i->ietf_version_or_minus_one;
    }
    p_Var1->ietf_spec_revision = (uint8_t)iVar2;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int
lws_create_client_ws_object(const struct lws_client_connect_info *i,
			    struct lws *wsi)
{
	int v = SPEC_LATEST_SUPPORTED;

	/* allocate the ws struct for the wsi */
	wsi->ws = lws_zalloc(sizeof(*wsi->ws), "client ws struct");
	if (!wsi->ws) {
		lwsl_notice("OOM\n");
		return 1;
	}

	/* -1 means just use latest supported */
	if (i->ietf_version_or_minus_one != -1 &&
	    i->ietf_version_or_minus_one)
		v = i->ietf_version_or_minus_one;

	wsi->ws->ietf_spec_revision = v;

	return 0;
}